

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O2

int ark_MRIStepInnerReset(MRIStepInnerStepper stepper,sunrealtype tR,N_Vector yR)

{
  int iVar1;
  void *arkode_mem;
  
  iVar1 = MRIStepInnerStepper_GetContent(stepper,&arkode_mem);
  if (iVar1 == 0) {
    iVar1 = ARKodeReset(arkode_mem,tR,yR);
    iVar1 = -(uint)(iVar1 != 0);
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int ark_MRIStepInnerReset(MRIStepInnerStepper stepper, sunrealtype tR, N_Vector yR)
{
  void* arkode_mem;
  int retval = MRIStepInnerStepper_GetContent(stepper, &arkode_mem);
  if (retval != ARK_SUCCESS) { return -1; }
  retval = ARKodeReset(arkode_mem, tR, yR);
  if (retval == ARK_SUCCESS) { return 0; }
  return -1;
}